

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O0

void __thiscall PoissonNoise::setThreshold(PoissonNoise *this)

{
  double dVar1;
  double dVar2;
  double var;
  PoissonNoise *this_local;
  
  dVar1 = NoiseSource::getIndicatorVariance((this->super_Noise).pParent,(this->super_Noise).nIndex);
  dVar2 = erfinv(-((this->super_Noise).noiseRate * 2.0) *
                 ((this->super_Noise).super_StochasticVariable.super_StochasticProcess.
                  super_TimeDependent.xTime)->dt + 1.0);
  dVar1 = sqrt(dVar1 * 2.0);
  this->poissonThreshold = dVar2 * dVar1;
  return;
}

Assistant:

void PoissonNoise::setThreshold()
{
	double var = pParent->getIndicatorVariance(nIndex);
	poissonThreshold = erfinv(1.0 - 2.0*noiseRate*xTime->dt) * sqrt(2*var);
//	cout << "threshold " << dThreshold << " for rate " << noiseRate << " with indicator variance " << var << endl;
}